

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O1

Lookups * verona::lookdown(Lookups *__return_storage_ptr__,Lookup *lookup,Node *id,Node *ta,
                          NodeSet *visited)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  element_type *peVar3;
  TokenDef *pTVar4;
  undefined8 *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar6;
  _Rb_tree_const_iterator<verona::Lookup> __first;
  NodeMap<Node> *pNVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Token *pTVar10;
  _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
  *p_Var11;
  _Base_ptr p_Var12;
  iterator iVar13;
  const_iterator __position;
  _Base_ptr p_Var14;
  pointer psVar15;
  _Rb_tree_header *p_Var16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar17;
  pair<std::_Rb_tree_iterator<std::shared_ptr<trieste::NodeDef>_>,_bool> pVar18;
  Lookup l;
  Lookups ldefs;
  Nodes defs;
  undefined1 local_188 [16];
  _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
  local_178;
  bool local_148;
  Node *local_140;
  Node *local_138;
  _Rb_tree<std::shared_ptr<trieste::NodeDef>,std::shared_ptr<trieste::NodeDef>,std::_Identity<std::shared_ptr<trieste::NodeDef>>,std::owner_less<void>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
  *local_130;
  Lookup local_128;
  Node local_e0;
  Node local_d0;
  Node local_c0;
  Node local_b0;
  Node local_a0;
  Node local_90;
  NodeMap<Node> *local_80;
  Nodes local_78;
  _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::_Identity<std::shared_ptr<trieste::NodeDef>_>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
  local_60;
  
  if ((lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    p_Var2 = &local_178._M_impl.super__Rb_tree_header;
    local_80 = &lookup->bindings;
    p_Var1 = &(lookup->bindings)._M_t._M_impl.super__Rb_tree_header;
    this = &(lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    local_140 = id;
    local_138 = ta;
    local_130 = (_Rb_tree<std::shared_ptr<trieste::NodeDef>,std::shared_ptr<trieste::NodeDef>,std::_Identity<std::shared_ptr<trieste::NodeDef>>,std::owner_less<void>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
                 *)visited;
    while (pVar18 = ::std::
                    _Rb_tree<std::shared_ptr<trieste::NodeDef>,std::shared_ptr<trieste::NodeDef>,std::_Identity<std::shared_ptr<trieste::NodeDef>>,std::owner_less<void>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
                    ::_M_insert_unique<std::shared_ptr<trieste::NodeDef>const&>
                              (local_130,&lookup->def),
          ((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_188._0_8_ = Class;
      local_188._8_8_ = Trait;
      local_178._M_impl._0_8_ = Function;
      pTVar10 = ::std::
                __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                          (local_188,p_Var2,
                           &((lookup->def).
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->type_);
      if ((_Rb_tree_header *)pTVar10 != p_Var2) {
        p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
        trieste::NodeDef::lookdown
                  (&local_78,
                   (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&((local_140->
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           )->location_);
        if (local_78.
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_78.
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __position._M_node =
               (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          psVar15 = local_78.
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (psVar15->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (psVar15->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
            if (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            Lookup::make((Lookup *)local_188,lookup,&local_90);
            if (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (local_138->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
            local_a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (local_138->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
            if (local_a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            apply_typeargs((Lookup *)local_188,&local_a0);
            if (local_a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_128.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_188._0_8_;
            local_128.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_;
            local_188._0_8_ = (element_type *)0x0;
            local_188._8_8_ = (element_type *)0x0;
            if (local_178._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header;
              pNVar7 = &local_128.bindings;
              local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            else {
              local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   local_178._M_impl.super__Rb_tree_header._M_header._M_color;
              local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_178._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_178._M_impl.super__Rb_tree_header._M_header._M_left;
              local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_178._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_178._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header;
              local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   local_178._M_impl.super__Rb_tree_header._M_node_count;
              local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_178._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_178._M_impl.super__Rb_tree_header._M_header;
              pNVar7 = (NodeMap<Node> *)&local_178._M_impl;
              local_178._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_178._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            *(size_t *)((long)&(pNVar7->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
            local_128.too_many_typeargs = local_148;
            ::std::
            _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
            ::~_Rb_tree(&local_178);
            if ((element_type *)local_188._8_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
            }
            local_188._0_8_ = __return_storage_ptr__;
            iVar13 = ::std::
                     _Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>
                     ::
                     _M_insert_unique_<verona::Lookup,std::_Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>::_Alloc_node>
                               ((_Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>
                                 *)__return_storage_ptr__,__position,&local_128,
                                (_Alloc_node *)local_188);
            __position._M_node = (_Base_ptr)::std::_Rb_tree_increment(iVar13._M_node);
            ::std::
            _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
            ::~_Rb_tree(&local_128.bindings._M_t);
            if ((element_type *)
                local_128.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_128.def.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            psVar15 = psVar15 + 1;
          } while (psVar15 !=
                   local_78.
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        ::std::
        vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
        ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   *)&local_78);
        return __return_storage_ptr__;
      }
      peVar3 = (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pTVar4 = (peVar3->type_).def;
      if (pTVar4 == (TokenDef *)TypeAlias) {
        local_128.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)Type;
        trieste::operator/((WFLookup *)local_188,&lookup->def,(Token *)&local_128);
        (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_188._8_8_;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (this,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178);
        this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_impl._0_8_;
LAB_001564d9:
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
      }
      else {
        if (pTVar4 == (TokenDef *)TypeParam) {
          p_Var14 = (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var12 = &p_Var1->_M_header;
          if (p_Var14 != (_Base_ptr)0x0) {
            do {
              bVar17 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(p_Var14 + 1) + 8) <
                       (lookup->def).
                       super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
              if (!bVar17) {
                p_Var12 = p_Var14;
              }
              p_Var14 = (&p_Var14->_M_left)[bVar17];
            } while (p_Var14 != (_Base_ptr)0x0);
          }
          p_Var16 = p_Var1;
          if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
             (p_Var16 = (_Rb_tree_header *)p_Var12,
             (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi <
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)p_Var12 + 0x28))) {
            p_Var16 = p_Var1;
          }
          if ((p_Var16 == p_Var1) ||
             (((*(element_type **)((long)(p_Var16 + 1) + 8))->type_).def ==
              (TokenDef *)TypeParamBind)) break;
          (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)((long)(p_Var16 + 1) + 8);
          __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)(p_Var16 + 1) + 0x10);
        }
        else {
          if (pTVar4 != (TokenDef *)Type) {
            local_188._0_8_ = FQType;
            local_188._8_8_ = FQFunction;
            p_Var11 = (_Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
                       *)::std::
                         __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                                   (local_188,&local_178,&peVar3->type_);
            if (p_Var11 != &local_178) {
              local_b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
              if (local_b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              resolve_fq((Lookup *)local_188,&local_b0);
              uVar9 = local_188._8_8_;
              uVar8 = local_188._0_8_;
              local_188._0_8_ = (element_type *)0x0;
              local_188._8_8_ = (element_type *)0x0;
              this_00 = (lookup->def).
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi;
              (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)uVar8;
              (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              ::std::
              _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
              ::clear(&local_80->_M_t);
              if (local_178._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_178._M_impl.super__Rb_tree_header._M_header._M_color;
                (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_178._M_impl.super__Rb_tree_header._M_header._M_parent;
                (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_178._M_impl.super__Rb_tree_header._M_header._M_left;
                (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_178._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_178._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     local_178._M_impl.super__Rb_tree_header._M_node_count;
                local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_178._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
                local_178._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
              }
              lookup->too_many_typeargs = local_148;
              ::std::
              _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
              ::~_Rb_tree(&local_178);
              this_01._M_pi =
                   local_b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((element_type *)local_188._8_8_ != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
                this_01._M_pi =
                     local_b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              goto LAB_001564d9;
            }
            peVar3 = (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            pTVar4 = (peVar3->type_).def;
            if (pTVar4 == (TokenDef *)TypeView) {
              psVar15 = *(pointer *)
                         ((long)&(peVar3->children).
                                 super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                                 ._M_impl.super__Vector_impl_data + 8);
              (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = psVar15[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
              ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (this,&psVar15[-1].
                               super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
              goto LAB_001564e3;
            }
            if (pTVar4 == (TokenDef *)TypeIsect) {
              p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
                   &p_Var1->_M_header;
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                   &p_Var1->_M_header;
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
              psVar15 = (peVar3->children).
                        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              psVar6 = *(pointer *)
                        ((long)&(peVar3->children).
                                super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                                ._M_impl.super__Vector_impl_data + 8);
              if (psVar15 == psVar6) {
                return __return_storage_ptr__;
              }
              do {
                local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (psVar15->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
                local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (psVar15->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                Lookup::make((Lookup *)local_188,lookup,&local_c0);
                if (local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_c0.
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                local_d0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (local_140->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
                local_d0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (local_140->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_d0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_d0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_d0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_d0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_d0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                local_e0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (local_138->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
                local_e0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (local_138->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_e0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_e0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_e0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_e0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_e0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                ::std::
                _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::_Identity<std::shared_ptr<trieste::NodeDef>_>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                ::_Rb_tree(&local_60,
                           (_Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::_Identity<std::shared_ptr<trieste::NodeDef>_>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                            *)local_130);
                lookdown((Lookups *)&local_128,(Lookup *)local_188,&local_d0,&local_e0,
                         (NodeSet *)&local_60);
                ::std::
                _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::_Identity<std::shared_ptr<trieste::NodeDef>_>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                ::~_Rb_tree(&local_60);
                if (local_e0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_e0.
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (local_d0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_d0.
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                __first._M_node._4_4_ =
                     local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
                __first._M_node._0_4_ =
                     local_128.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
                ::std::
                _Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>
                ::_M_insert_range_unique<std::_Rb_tree_const_iterator<verona::Lookup>>
                          ((_Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>
                            *)__return_storage_ptr__,__first,
                           (_Rb_tree_const_iterator<verona::Lookup>)
                           &local_128.def.
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                ::std::
                _Rb_tree<verona::Lookup,_verona::Lookup,_std::_Identity<verona::Lookup>,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
                ::~_Rb_tree((_Rb_tree<verona::Lookup,_verona::Lookup,_std::_Identity<verona::Lookup>,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
                             *)&local_128);
                ::std::
                _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
                ::~_Rb_tree(&local_178);
                if ((element_type *)local_188._8_8_ != (element_type *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
                }
                psVar15 = psVar15 + 1;
              } while (psVar15 != psVar6);
              return __return_storage_ptr__;
            }
            if (pTVar4 != (TokenDef *)TypeUnion) {
              local_188._0_8_ = &TypeList;
              local_188._8_8_ = TypeTuple;
              local_178._M_impl._0_8_ = TypeVar;
              ::std::
              __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                        (local_188,&local_178._M_impl.super__Rb_tree_header,&peVar3->type_);
            }
            break;
          }
          puVar5 = (undefined8 *)
                   (peVar3->children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*puVar5;
          __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar5 + 1);
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this,__r);
      }
LAB_001564e3:
      if ((lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) break;
    }
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return __return_storage_ptr__;
}

Assistant:

Lookups lookdown(Lookup& lookup, Node id, Node ta, NodeSet visited)
  {
    while (true)
    {
      // Stop on a failed lookup.
      if (!lookup.def)
        return {};

      // Check if we've visited this node before. If so, we've found a cycle.
      auto inserted = visited.insert(lookup.def);
      if (!inserted.second)
        return {};

      if (lookup.def->in({Class, Trait, Function}))
      {
        // Return all lookdowns in the found class, trait, or function.
        Lookups result;
        auto defs = lookup.def->lookdown(id->location());

        std::transform(
          defs.begin(),
          defs.end(),
          std::inserter(result, result.begin()),
          [&](auto& def) {
            auto l = lookup.make(def);
            apply_typeargs(l, ta);
            return l;
          });

        return result;
      }
      else if (lookup.def == TypeAlias)
      {
        // Replace the def with our type alias and try again.
        lookup.def = lookup.def / Type;
      }
      else if (lookup.def == TypeParam)
      {
        // Replace the typeparam with the bound typearg and try again.
        auto it = lookup.bindings.find(lookup.def);

        // Except in testing, there should always be a binding. If it's bound
        // to itself, then we're done.
        if ((it == lookup.bindings.end()) || (it->second == TypeParamBind))
          return {};

        lookup.def = it->second;
      }
      // The remainder of cases arise from a Use, a TypeAlias, or a TypeParam.
      // They will all result in some number of name resolutions.
      else if (lookup.def == Type)
      {
        // Replace the def with the content of the type and try again.
        // Use `front()` instead of `def / Type` to allow looking up in `use`
        // directives before Type is no longer a sequence.
        lookup.def = lookup.def->front();
      }
      else if (lookup.def->in({FQType, FQFunction}))
      {
        // Resolve the name and try again.
        lookup = resolve_fq(lookup.def);
      }
      else if (lookup.def == TypeView)
      {
        // Replace the def with the rhs of the view and try again.
        lookup.def = lookup.def->back();
      }
      else if (lookup.def == TypeIsect)
      {
        // Return everything we find.
        Lookups result;

        for (auto& t : *lookup.def)
        {
          auto l = lookup.make(t);
          auto ldefs = lookdown(l, id, ta, visited);
          result.insert(ldefs.begin(), ldefs.end());
        }

        return result;
      }
      else if (lookup.def == TypeUnion)
      {
        // TODO: return only things that are identical in all disjunctions
        return {};
      }
      else if (lookup.def->in({TypeList, TypeTuple, TypeVar}))
      {
        // Nothing to do here.
        return {};
      }
      else
      {
        // This type isn't resolved yet.
        return {};
      }
    }
  }